

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SpanDeathTest_BoundsChecks_Test::TestBody
          (SpanDeathTest_BoundsChecks_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  StringLike<const_char_*> *regex_05;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  DeathTest *gtest_dt;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertHelper local_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_88;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x33e279;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f0,
               (testing *)&local_f8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_40,(PolymorphicMatcher *)&local_f0);
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("span[3]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6b,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_40);
    _Var6._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00152831;
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar3 == 0) {
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_00152831;
        }
      }
      else if (iVar3 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) goto LAB_001530b7;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      goto LAB_00152884;
    }
  }
  else {
LAB_00152831:
    testing::Message::Message((Message *)&local_f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar5 = *(long *)local_f0._M_head_impl;
      _Var6._M_head_impl = local_f0._M_head_impl;
LAB_00152884:
      (**(code **)(lVar5 + 8))(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x33e279;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f0,
               (testing *)&local_f8,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_58,(PolymorphicMatcher *)&local_f0);
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("span.subspan(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6c,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_58);
    _Var6._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00152990;
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar3 == 0) {
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_00152990;
        }
      }
      else if (iVar3 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) goto LAB_001530b7;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      goto LAB_001529e3;
    }
  }
  else {
LAB_00152990:
    testing::Message::Message((Message *)&local_f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar5 = *(long *)local_f0._M_head_impl;
      _Var6._M_head_impl = local_f0._M_head_impl;
LAB_001529e3:
      (**(code **)(lVar5 + 8))(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x33e279;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f0,
               (testing *)&local_f8,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_70,(PolymorphicMatcher *)&local_f0);
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("span.first(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6d,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_70);
    _Var6._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00152aef;
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar3 == 0) {
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_00152aef;
        }
      }
      else if (iVar3 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) goto LAB_001530b7;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      goto LAB_00152b42;
    }
  }
  else {
LAB_00152aef:
    testing::Message::Message((Message *)&local_f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar5 = *(long *)local_f0._M_head_impl;
      _Var6._M_head_impl = local_f0._M_head_impl;
LAB_00152b42:
      (**(code **)(lVar5 + 8))(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x33e279;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f0,
               (testing *)&local_f8,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_88,(PolymorphicMatcher *)&local_f0);
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("span.last(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6e,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_88);
    _Var6._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00152c4e;
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar3 == 0) {
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_00152c4e;
        }
      }
      else if (iVar3 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) goto LAB_001530b7;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      goto LAB_00152ca1;
    }
  }
  else {
LAB_00152c4e:
    testing::Message::Message((Message *)&local_f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar5 = *(long *)local_f0._M_head_impl;
      _Var6._M_head_impl = local_f0._M_head_impl;
LAB_00152ca1:
      (**(code **)(lVar5 + 8))(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x33e279;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f0,
               (testing *)&local_f8,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)&local_f0);
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("empty[0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x71,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    _Var6._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00152da4;
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar3 == 0) {
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_00152da4;
        }
      }
      else if (iVar3 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) goto LAB_001530b7;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      goto LAB_00152df7;
    }
  }
  else {
LAB_00152da4:
    testing::Message::Message((Message *)&local_f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x71,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar5 = *(long *)local_f0._M_head_impl;
      _Var6._M_head_impl = local_f0._M_head_impl;
LAB_00152df7:
      (**(code **)(lVar5 + 8))(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x33e279;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f0,
               (testing *)&local_f8,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_b8,(PolymorphicMatcher *)&local_f0);
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("empty.front()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x72,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b8);
    _Var6._M_head_impl = local_100._M_head_impl;
    if (!bVar2) goto LAB_00152efa;
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar3 == 0) {
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (**(code **)(*(long *)_Var1._M_head_impl + 0x20))(_Var1._M_head_impl,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_00152efa;
        }
      }
      else if (iVar3 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) goto LAB_001530b7;
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      goto LAB_00152f4d;
    }
  }
  else {
LAB_00152efa:
    testing::Message::Message((Message *)&local_f0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x72,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar5 = *(long *)local_f0._M_head_impl;
      _Var6._M_head_impl = local_f0._M_head_impl;
LAB_00152f4d:
      (**(code **)(lVar5 + 8))(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_f8.data_ = (AssertHelperData *)0x33e279;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_f0,
               (testing *)&local_f8,regex_05);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_d0,(PolymorphicMatcher *)&local_f0);
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("empty.back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_d0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x73,(DeathTest **)&local_100);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_d0);
    _Var6._M_head_impl = local_100._M_head_impl;
    if (bVar2) {
      if (local_100._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x10))(local_100._M_head_impl);
      _Var1._M_head_impl = local_100._M_head_impl;
      if (iVar3 == 0) {
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x18))(local_100._M_head_impl);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (**(code **)(*(long *)local_100._M_head_impl + 0x20))
                          (local_100._M_head_impl,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_00153050;
        }
      }
      else if (iVar3 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
LAB_001530b7:
          abort();
        }
        (**(code **)(*(long *)local_100._M_head_impl + 0x28))(local_100._M_head_impl,2);
        (**(code **)(*(long *)_Var1._M_head_impl + 0x28))(_Var1._M_head_impl,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      local_f0._M_head_impl = _Var6._M_head_impl;
      goto LAB_001530a3;
    }
  }
LAB_00153050:
  testing::Message::Message((Message *)&local_f0);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
             ,0x73,pcVar4);
  testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
  testing::internal::AssertHelper::~AssertHelper(&local_f8);
  if (local_f0._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  lVar5 = *(long *)local_f0._M_head_impl;
LAB_001530a3:
  (**(code **)(lVar5 + 8))(local_f0._M_head_impl);
  return;
}

Assistant:

TEST(SpanDeathTest, BoundsChecks) {
  // Make an array that's larger than we need, so that a failure to bounds check
  // won't crash.
  const int v[] = {1, 2, 3, 4};
  Span<const int> span(v, 3);
  // Out of bounds access.
  EXPECT_DEATH_IF_SUPPORTED(span[3], "");
  EXPECT_DEATH_IF_SUPPORTED(span.subspan(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.first(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.last(4), "");
  // Accessing an empty span.
  Span<const int> empty(v, 0);
  EXPECT_DEATH_IF_SUPPORTED(empty[0], "");
  EXPECT_DEATH_IF_SUPPORTED(empty.front(), "");
  EXPECT_DEATH_IF_SUPPORTED(empty.back(), "");
}